

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

void google::protobuf::DescriptorProto::SharedDtor(MessageLite *self)

{
  MessageOptions *this;
  ulong uVar1;
  
  if (((self->_internal_metadata_).ptr_ & 1) != 0) {
    internal::InternalMetadata::DeleteOutOfLineHelper<google::protobuf::UnknownFieldSet>
              (&self->_internal_metadata_);
  }
  uVar1 = (self->_internal_metadata_).ptr_;
  if ((uVar1 & 1) != 0) {
    uVar1 = *(ulong *)(uVar1 & 0xfffffffffffffffe);
  }
  if (uVar1 == 0) {
    internal::ArenaStringPtr::Destroy((ArenaStringPtr *)&self[0xd]._internal_metadata_);
    this = (MessageOptions *)self[0xe]._vptr_MessageLite;
    if (this != (MessageOptions *)0x0) {
      MessageOptions::~MessageOptions(this);
      operator_delete(this,0x58);
    }
    RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~RepeatedPtrField((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)(self + 0xc));
    RepeatedPtrField<google::protobuf::DescriptorProto_ReservedRange>::~RepeatedPtrField
              ((RepeatedPtrField<google::protobuf::DescriptorProto_ReservedRange> *)
               &self[10]._internal_metadata_);
    RepeatedPtrField<google::protobuf::OneofDescriptorProto>::~RepeatedPtrField
              ((RepeatedPtrField<google::protobuf::OneofDescriptorProto> *)(self + 9));
    RepeatedPtrField<google::protobuf::FieldDescriptorProto>::~RepeatedPtrField
              ((RepeatedPtrField<google::protobuf::FieldDescriptorProto> *)
               &self[7]._internal_metadata_);
    RepeatedPtrField<google::protobuf::DescriptorProto_ExtensionRange>::~RepeatedPtrField
              ((RepeatedPtrField<google::protobuf::DescriptorProto_ExtensionRange> *)(self + 6));
    RepeatedPtrField<google::protobuf::EnumDescriptorProto>::~RepeatedPtrField
              ((RepeatedPtrField<google::protobuf::EnumDescriptorProto> *)
               &self[4]._internal_metadata_);
    RepeatedPtrField<google::protobuf::DescriptorProto>::~RepeatedPtrField
              ((RepeatedPtrField<google::protobuf::DescriptorProto> *)(self + 3));
    RepeatedPtrField<google::protobuf::FieldDescriptorProto>::~RepeatedPtrField
              ((RepeatedPtrField<google::protobuf::FieldDescriptorProto> *)
               &self[1]._internal_metadata_);
    return;
  }
  SharedDtor((DescriptorProto *)&stack0xffffffffffffffe0);
}

Assistant:

inline void DescriptorProto::SharedDtor(MessageLite& self) {
  DescriptorProto& this_ = static_cast<DescriptorProto&>(self);
  this_._internal_metadata_.Delete<::google::protobuf::UnknownFieldSet>();
  ABSL_DCHECK(this_.GetArena() == nullptr);
  this_._impl_.name_.Destroy();
  delete this_._impl_.options_;
  this_._impl_.~Impl_();
}